

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall ncnn::Crop::load_param(Crop *this,ParamDict *pd)

{
  int iVar1;
  Mat *def;
  bool bVar2;
  undefined1 auVar3 [16];
  Mat local_b0;
  Mat local_68;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->woffset = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->hoffset = iVar1;
  iVar1 = ParamDict::get(pd,0xd,0);
  this->doffset = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->coffset = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->outw = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->outh = iVar1;
  iVar1 = ParamDict::get(pd,0xe,0);
  this->outd = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->outc = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->woffset2 = iVar1;
  iVar1 = ParamDict::get(pd,7,0);
  this->hoffset2 = iVar1;
  iVar1 = ParamDict::get(pd,0xf,0);
  this->doffset2 = iVar1;
  iVar1 = ParamDict::get(pd,8,0);
  this->coffset2 = iVar1;
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b0,pd,9,&local_68);
  Mat::operator=(&this->starts,&local_b0);
  Mat::~Mat(&local_b0);
  Mat::~Mat(&local_68);
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b0,pd,10,&local_68);
  Mat::operator=(&this->ends,&local_b0);
  Mat::~Mat(&local_b0);
  Mat::~Mat(&local_68);
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  def = &local_68;
  ParamDict::get(&local_b0,pd,0xb,def);
  Mat::operator=(&this->axes,&local_b0);
  Mat::~Mat(&local_b0);
  Mat::~Mat(&local_68);
  if ((this->starts).data == (void *)0x0) {
    bVar2 = false;
  }
  else {
    def = (Mat *)((long)(this->starts).c * (this->starts).cstep);
    bVar2 = false;
    if ((def != (Mat *)0x0) && ((this->ends).data != (void *)0x0)) {
      bVar2 = (long)(this->ends).c * (this->ends).cstep != 0;
    }
  }
  auVar3._0_4_ = -(uint)(this->woffset2 == 0 && this->outw == 0);
  auVar3._4_4_ = -(uint)(this->hoffset2 == 0 && this->outh == 0);
  auVar3._8_4_ = -(uint)(this->doffset2 == 0 && this->outd == 0);
  auVar3._12_4_ = -(uint)(this->coffset2 == 0 && this->outc == 0);
  iVar1 = movmskps((int)def,auVar3);
  if ((iVar1 == 0xf) && (!bVar2)) {
    (this->super_Layer).one_blob_only = false;
  }
  return 0;
}

Assistant:

int Crop::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    doffset = pd.get(13, 0);
    coffset = pd.get(2, 0);
    outw = pd.get(3, 0);
    outh = pd.get(4, 0);
    outd = pd.get(14, 0);
    outc = pd.get(5, 0);
    woffset2 = pd.get(6, 0);
    hoffset2 = pd.get(7, 0);
    doffset2 = pd.get(15, 0);
    coffset2 = pd.get(8, 0);

    starts = pd.get(9, Mat());
    ends = pd.get(10, Mat());
    axes = pd.get(11, Mat());

    bool numpy_style_slice = !starts.empty() && !ends.empty();

    if (outw == 0 && outh == 0 && outd == 0 && outc == 0 && woffset2 == 0 && hoffset2 == 0 && doffset2 == 0 && coffset2 == 0 && !numpy_style_slice)
    {
        one_blob_only = false;
    }

    return 0;
}